

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

int lws_raw_transaction_completed(lws *wsi)

{
  int iVar1;
  lws_log_cx_t *cx;
  
  if (wsi->buflist_out == (lws_buflist *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (wsi == (lws *)0x0) {
      cx = (lws_log_cx_t *)0x0;
    }
    else {
      cx = (wsi->lc).log_cx;
    }
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,0x10,"lws_raw_transaction_completed",
                "deferring due to partial");
    wsi->field_0x472 = wsi->field_0x472 | 0x10;
    lws_callback_on_writable(wsi);
  }
  return iVar1;
}

Assistant:

int LWS_WARN_UNUSED_RESULT
lws_raw_transaction_completed(struct lws *wsi)
{
	if (lws_has_buffered_out(wsi)) {
		/*
		 * ...so he tried to send something large, but it went out
		 * as a partial, but he immediately called us to say he wants
		 * to close the connection.
		 *
		 * Defer the close until the last part of the partial is sent.
		 *
		 */

		lwsl_wsi_debug(wsi, "deferring due to partial");
		wsi->close_when_buffered_out_drained = 1;
		lws_callback_on_writable(wsi);

		return 0;
	}

	return -1;
}